

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlOutputBufferWrite(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlOutputBufferPtr val_00;
  char *__s;
  size_t sVar3;
  int local_3c;
  int n_buf;
  char *buf;
  int n_len;
  int len;
  int n_out;
  xmlOutputBufferPtr out;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_len = 0; n_len < 2; n_len = n_len + 1) {
    for (buf._4_4_ = 0; (int)buf._4_4_ < 4; buf._4_4_ = buf._4_4_ + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_xmlOutputBufferPtr(n_len,0);
        iVar2 = gen_int(buf._4_4_,1);
        __s = gen_const_char_ptr(local_3c,2);
        if ((__s == (char *)0x0) || (sVar3 = strlen(__s), iVar2 <= (int)sVar3 + 1)) {
          val = xmlOutputBufferWrite(val_00,iVar2,__s);
          desret_int(val);
          call_tests = call_tests + 1;
          des_xmlOutputBufferPtr(n_len,val_00,0);
          des_int(buf._4_4_,iVar2,1);
          des_const_char_ptr(local_3c,__s,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlOutputBufferWrite",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)(uint)n_len);
            printf(" %d",(ulong)buf._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlOutputBufferWrite(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    xmlOutputBufferPtr out; /* a buffered parser output */
    int n_out;
    int len; /* the size in bytes of the array. */
    int n_len;
    char * buf; /* an char array */
    int n_buf;

    for (n_out = 0;n_out < gen_nb_xmlOutputBufferPtr;n_out++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
    for (n_buf = 0;n_buf < gen_nb_const_char_ptr;n_buf++) {
        mem_base = xmlMemBlocks();
        out = gen_xmlOutputBufferPtr(n_out, 0);
        len = gen_int(n_len, 1);
        buf = gen_const_char_ptr(n_buf, 2);
        if ((buf != NULL) &&
            (len > (int) strlen((const char *) buf) + 1))
            continue;

        ret_val = xmlOutputBufferWrite(out, len, (const char *)buf);
        desret_int(ret_val);
        call_tests++;
        des_xmlOutputBufferPtr(n_out, out, 0);
        des_int(n_len, len, 1);
        des_const_char_ptr(n_buf, (const char *)buf, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlOutputBufferWrite",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf(" %d", n_len);
            printf(" %d", n_buf);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}